

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::detail::dtoa_impl::grisu2
               (char *buf,int *len,int *decimal_exponent,diyfp m_minus,diyfp v,diyfp m_plus)

{
  int *this;
  cached_power cVar1;
  diyfp dVar2;
  diyfp dVar3;
  diyfp dVar4;
  undefined4 local_d8;
  undefined1 local_d0 [8];
  diyfp M_plus;
  diyfp M_minus;
  diyfp w_plus;
  diyfp w_minus;
  diyfp w;
  diyfp c_minus_k;
  cached_power cached;
  int *decimal_exponent_local;
  int *len_local;
  char *buf_local;
  diyfp m_minus_local;
  
  buf_local = (char *)m_minus.f;
  m_minus_local.f._0_4_ = m_minus.e;
  if (m_plus.e != (int)m_minus_local.f) {
    __assert_fail("m_plus.e == m_minus.e",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x237e,
                  "void nlohmann::detail::dtoa_impl::grisu2(char *, int &, int &, diyfp, diyfp, diyfp)"
                 );
  }
  if (m_plus.e == v.e) {
    cVar1 = get_cached_power_for_binary_exponent(m_plus.e);
    c_minus_k._8_8_ = cVar1.f;
    cached.f._0_4_ = cVar1.e;
    this = &w.e;
    diyfp::diyfp((diyfp *)this,c_minus_k._8_8_,(int)cached.f);
    dVar2 = diyfp::mul(&v,(diyfp *)this);
    w.f._0_4_ = dVar2.e;
    dVar3 = diyfp::mul((diyfp *)&buf_local,(diyfp *)this);
    dVar4 = diyfp::mul(&m_plus,(diyfp *)this);
    diyfp::diyfp((diyfp *)&M_plus.e,dVar3.f + 1,dVar3.e);
    diyfp::diyfp((diyfp *)local_d0,dVar4.f - 1,dVar4.e);
    cached.f._4_4_ = cVar1.k;
    *decimal_exponent = -cached.f._4_4_;
    local_d8 = (undefined4)M_minus.f;
    dVar3._12_4_ = w.f._4_4_;
    dVar3.e = (int)w.f;
    dVar4.e = local_d8;
    dVar4.f = M_plus._8_8_;
    dVar3.f = dVar2.f;
    dVar2._8_8_ = M_plus.f;
    dVar2.f = (uint64_t)local_d0;
    dVar4._12_4_ = 0;
    grisu2_digit_gen(buf,len,decimal_exponent,dVar4,dVar3,dVar2);
    return;
  }
  __assert_fail("m_plus.e == v.e",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                ,0x237f,
                "void nlohmann::detail::dtoa_impl::grisu2(char *, int &, int &, diyfp, diyfp, diyfp)"
               );
}

Assistant:

inline void grisu2(char* buf, int& len, int& decimal_exponent, diyfp m_minus, diyfp v, diyfp m_plus) {
	assert(m_plus.e == m_minus.e);
	assert(m_plus.e == v.e);

	//  --------(-----------------------+-----------------------)--------    (A)
	//          m-                      v                       m+
	//
	//  --------------------(-----------+-----------------------)--------    (B)
	//                      m-          v                       m+
	//
	// First scale v (and m- and m+) such that the exponent is in the range
	// [alpha, gamma].

	const cached_power cached = get_cached_power_for_binary_exponent(m_plus.e);

	const diyfp c_minus_k(cached.f, cached.e);  // = c ~= 10^-k

	// The exponent of the products is = v.e + c_minus_k.e + q and is in the range [alpha,gamma]
	const diyfp w = diyfp::mul(v, c_minus_k);
	const diyfp w_minus = diyfp::mul(m_minus, c_minus_k);
	const diyfp w_plus = diyfp::mul(m_plus, c_minus_k);

	//  ----(---+---)---------------(---+---)---------------(---+---)----
	//          w-                      w                       w+
	//          = c*m-                  = c*v                   = c*m+
	//
	// diyfp::mul rounds its result and c_minus_k is approximated too. w, w- and
	// w+ are now off by a small amount.
	// In fact:
	//
	//      w - v * 10^k < 1 ulp
	//
	// To account for this inaccuracy, add resp. subtract 1 ulp.
	//
	//  --------+---[---------------(---+---)---------------]---+--------
	//          w-  M-                  w                   M+  w+
	//
	// Now any number in [M-, M+] (bounds included) will round to w when input,
	// regardless of how the input rounding algorithm breaks ties.
	//
	// And digit_gen generates the shortest possible such number in [M-, M+].
	// Note that this does not mean that Grisu2 always generates the shortest
	// possible number in the interval (m-, m+).
	const diyfp M_minus(w_minus.f + 1, w_minus.e);
	const diyfp M_plus(w_plus.f - 1, w_plus.e);

	decimal_exponent = -cached.k;  // = -(-k) = k

	grisu2_digit_gen(buf, len, decimal_exponent, M_minus, w, M_plus);
}